

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_random.c
# Opt level: O0

uint8_t arc4_getbyte(void)

{
  byte bVar1;
  byte bVar2;
  uint8_t sj;
  uint8_t si;
  
  rs.i = rs.i + 1;
  bVar1 = rs.s[rs.i];
  rs.j = rs.j + bVar1;
  bVar2 = rs.s[rs.j];
  rs.s[rs.i] = bVar2;
  rs.s[rs.j] = bVar1;
  return rs.s[(int)((uint)bVar1 + (uint)bVar2 & 0xff)];
}

Assistant:

static inline uint8_t
arc4_getbyte(void)
{
	uint8_t si, sj;

	rs.i = (rs.i + 1);
	si = rs.s[rs.i];
	rs.j = (rs.j + si);
	sj = rs.s[rs.j];
	rs.s[rs.i] = sj;
	rs.s[rs.j] = si;
	return (rs.s[(si + sj) & 0xff]);
}